

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O3

Candidate * __thiscall
fizplex::Simplex::run_price(Candidate *__return_storage_ptr__,Simplex *this,Base *base)

{
  size_t sVar1;
  double *pdVar2;
  SVector *rhs;
  size_t i_1;
  size_t i;
  ulong uVar3;
  DVector pi;
  DVector d;
  Pricer local_71;
  double local_70;
  double local_68;
  DVector local_60;
  DVector local_48;
  
  sVar1 = ColMatrix::row_count(&this->lp->A);
  DVector::DVector(&local_60,sVar1);
  sVar1 = ColMatrix::col_count(&this->lp->A);
  DVector::DVector(&local_48,sVar1);
  uVar3 = 0;
  while( true ) {
    sVar1 = ColMatrix::row_count(&this->lp->A);
    if (sVar1 <= uVar3) break;
    pdVar2 = DVector::operator[](&this->c,(this->basic_indices).
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar3]);
    local_70 = *pdVar2;
    pdVar2 = DVector::operator[](&local_60,uVar3);
    *pdVar2 = local_70;
    uVar3 = uVar3 + 1;
  }
  Base::btran(base,&local_60);
  uVar3 = 0;
  while( true ) {
    sVar1 = ColMatrix::col_count(&this->lp->A);
    if (sVar1 <= uVar3) break;
    pdVar2 = DVector::operator[](&this->c,uVar3);
    local_70 = *pdVar2;
    rhs = ColMatrix::column(&this->lp->A,uVar3);
    local_68 = DVector::operator*(&local_60,rhs);
    pdVar2 = DVector::operator[](&local_48,uVar3);
    *pdVar2 = local_70 - local_68;
    uVar3 = uVar3 + 1;
  }
  Pricer::price(__return_storage_ptr__,&local_71,&this->x,this->lp,&local_48,
                &this->non_basic_indices);
  operator_delete(local_48.vals._M_data);
  operator_delete(local_60.vals._M_data);
  return __return_storage_ptr__;
}

Assistant:

Simplex::Candidate Simplex::run_price(const Base &base) const {
  DVector pi(lp.A.row_count());
  DVector d(lp.A.col_count());
  for (size_t i = 0; i < lp.A.row_count(); i++)
    pi[i] = c[basic_indices[i]]; // ==c_B
  base.btran(pi);
  for (size_t i = 0; i < lp.A.col_count(); i++)
    d[i] = c[i] - pi * lp.A.column(i);

  return Pricer().price(x, lp, d, non_basic_indices);
}